

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O1

void __thiscall
amrex::FluxRegister::CrseAdd
          (FluxRegister *this,MultiFab *mflx,MultiFab *area,int dir,int srccomp,int destcomp,
          int numcomp,Real mult,Geometry *geom)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  Periodicity PVar12;
  Orientation face_lo;
  MFIter mfi;
  Array4<const_double> sfab;
  Array4<double> dfab;
  Array4<const_double> afab;
  MultiFab mf;
  long local_338;
  long local_330;
  Box local_2f4;
  undefined1 local_2d8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  int local_2b0;
  Array4<const_double> local_270;
  Array4<double> local_230;
  Array4<const_double> local_1f0;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_2d8._1_7_ = 0;
  local_2d8[0] = true;
  local_2d8._8_4_ = 0;
  local_2d8._12_4_ = 0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFab::MultiFab((MultiFab *)&local_1b0,
                     &(mflx->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     &(mflx->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     numcomp,0,(MFInfo *)local_2d8,
                     (mflx->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  MFIter::MFIter((MFIter *)local_2d8,(FabArrayBase *)mflx,true);
  if ((int)local_2c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_2b0) {
    do {
      MFIter::tilebox(&local_2f4,(MFIter *)local_2d8);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_230,&local_1b0,(MFIter *)local_2d8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_270,&mflx->super_FabArray<amrex::FArrayBox>,(MFIter *)local_2d8);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1f0,&area->super_FabArray<amrex::FArrayBox>,(MFIter *)local_2d8);
      if (0 < numcomp) {
        lVar5 = (long)local_2f4.smallend.vect[1];
        lVar6 = (long)local_2f4.smallend.vect[0] * 8;
        local_330 = 0;
        uVar3 = 0;
        local_338 = (long)srccomp << 3;
        do {
          iVar9 = local_2f4.smallend.vect[2];
          if (local_2f4.smallend.vect[2] <= local_2f4.bigend.vect[2]) {
            do {
              if (local_2f4.smallend.vect[1] <= local_2f4.bigend.vect[1]) {
                lVar7 = (long)iVar9;
                lVar4 = (long)local_270.p +
                        local_270.nstride * local_338 +
                        (lVar5 - local_270.begin.y) * local_270.jstride * 8 +
                        (lVar7 - local_270.begin.z) * local_270.kstride * 8 +
                        (long)local_270.begin.x * -8 + lVar6;
                lVar10 = (long)local_1f0.p +
                         (lVar5 - local_1f0.begin.y) * local_1f0.jstride * 8 +
                         (lVar7 - local_1f0.begin.z) * local_1f0.kstride * 8 +
                         (long)local_1f0.begin.x * -8 + lVar6;
                lVar8 = (long)local_230.p +
                        local_230.nstride * local_330 +
                        (lVar5 - local_230.begin.y) * local_230.jstride * 8 +
                        (lVar7 - local_230.begin.z) * local_230.kstride * 8 +
                        (long)local_230.begin.x * -8 + lVar6;
                lVar7 = lVar5;
                do {
                  if (local_2f4.smallend.vect[0] <= local_2f4.bigend.vect[0]) {
                    lVar2 = 0;
                    do {
                      *(double *)(lVar8 + lVar2 * 8) =
                           *(double *)(lVar4 + lVar2 * 8) * mult * *(double *)(lVar10 + lVar2 * 8);
                      lVar2 = lVar2 + 1;
                    } while ((local_2f4.bigend.vect[0] - local_2f4.smallend.vect[0]) + 1 !=
                             (int)lVar2);
                  }
                  lVar7 = lVar7 + 1;
                  lVar4 = lVar4 + local_270.jstride * 8;
                  lVar10 = lVar10 + local_1f0.jstride * 8;
                  lVar8 = lVar8 + local_230.jstride * 8;
                } while (local_2f4.bigend.vect[1] + 1 != (int)lVar7);
              }
              bVar11 = iVar9 != local_2f4.bigend.vect[2];
              iVar9 = iVar9 + 1;
            } while (bVar11);
          }
          uVar3 = uVar3 + 1;
          local_338 = local_338 + 8;
          local_330 = local_330 + 8;
        } while (uVar3 != (uint)numcomp);
      }
      MFIter::operator++((MFIter *)local_2d8);
    } while ((int)local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_2b0);
  }
  MFIter::~MFIter((MFIter *)local_2d8);
  iVar9 = 1;
  do {
    iVar1 = dir + 3;
    if (iVar9 == 1) {
      iVar1 = dir;
    }
    PVar12 = Geometry::periodicity(geom);
    local_2d8[0] = PVar12.period.vect[0]._0_1_;
    local_2d8._1_7_ = PVar12.period.vect._1_7_;
    local_2d8._8_4_ = PVar12.period.vect[2];
    FabSet::plusFrom((this->super_BndryRegister).bndry + iVar1,(MultiFab *)&local_1b0,0,0,destcomp,
                     numcomp,(Periodicity *)local_2d8);
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
FluxRegister::CrseAdd (const MultiFab& mflx,
                       const MultiFab& area,
                       int             dir,
                       int             srccomp,
                       int             destcomp,
                       int             numcomp,
                       Real            mult,
                       const Geometry& geom)
{
    BL_ASSERT(srccomp >= 0 && srccomp+numcomp <= mflx.nComp());
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    const Orientation face_lo(dir,Orientation::low);
    const Orientation face_hi(dir,Orientation::high);

    MultiFab mf(mflx.boxArray(),mflx.DistributionMap(),numcomp,0,
                MFInfo(), mflx.Factory());

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mflx.isFusingCandidate()) {
        auto const& dma = mf.arrays();
        auto const& sma = mflx.const_arrays();
        auto const& ama = area.const_arrays();
        ParallelFor(mf, IntVect(0), numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dma[box_no](i,j,k,n) = sma[box_no](i,j,k,n+srccomp)*mult*ama[box_no](i,j,k);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mflx,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto       dfab =   mf.array(mfi);
            auto const sfab = mflx.const_array(mfi);
            auto const afab = area.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, numcomp, i, j, k, n,
            {
                dfab(i,j,k,n) = sfab(i,j,k,n+srccomp)*mult*afab(i,j,k);
            });
        }
    }

    for (int pass = 0; pass < 2; pass++)
    {
        const Orientation face = ((pass == 0) ? face_lo : face_hi);
        bndry[face].plusFrom(mf,0,0,destcomp,numcomp,geom.periodicity());
    }
}